

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O2

void purge_logically_deleted_doc_test(void)

{
  void *pvVar1;
  fdb_doc *pfVar2;
  void *pvVar3;
  fdb_doc *pfVar4;
  fdb_status fVar5;
  int iVar6;
  size_t keylen;
  size_t metalen;
  size_t bodylen;
  ulong uVar7;
  char *__format;
  long lVar8;
  fdb_doc *rdoc;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  fdb_doc *apfStack_4b8 [5];
  size_t *local_490;
  timeval __test_begin;
  fdb_kvs_config kvs_config;
  char metabuf [256];
  char keybuf [256];
  fdb_config fconfig;
  char bodybuf [256];
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  memleak_start();
  rdoc = (fdb_doc *)0x0;
  system("rm -rf  dummy* fdb_test_config.json > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fconfig.buffercache_size = 0;
  fconfig.wal_threshold = 0x400;
  fconfig.flags = 1;
  fconfig.purging_interval = 2;
  fconfig.compaction_threshold = '\0';
  fdb_open(&dbfile,"./dummy1",&fconfig);
  fdb_kvs_open_default(dbfile,&db,&kvs_config);
  fVar5 = fdb_set_log_callback(db,logCallbackFunc,"purge_logically_deleted_doc_test");
  if (fVar5 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0xcc8);
    purge_logically_deleted_doc_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0xcc8,"void purge_logically_deleted_doc_test()");
  }
  lVar8 = 0;
  for (uVar7 = 0; uVar7 != 10; uVar7 = uVar7 + 1) {
    sprintf(keybuf,"key%d",uVar7 & 0xffffffff);
    sprintf(metabuf,"meta%d",uVar7 & 0xffffffff);
    sprintf(bodybuf,"body%d",uVar7 & 0xffffffff);
    keylen = strlen(keybuf);
    metalen = strlen(metabuf);
    bodylen = strlen(bodybuf);
    fdb_doc_create((fdb_doc **)((long)apfStack_4b8 + lVar8),keybuf,keylen,metabuf,metalen,bodybuf,
                   bodylen);
    fdb_set(db,apfStack_4b8[uVar7]);
    lVar8 = lVar8 + 8;
  }
  fdb_doc_create(&rdoc,(void *)local_490[4],*local_490,(void *)local_490[7],local_490[1],(void *)0x0
                 ,0);
  fVar5 = fdb_del(db,rdoc);
  if (fVar5 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0xcd7);
    purge_logically_deleted_doc_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0xcd7,"void purge_logically_deleted_doc_test()");
  }
  fdb_doc_free(rdoc);
  rdoc = (fdb_doc *)0x0;
  lVar8 = 0;
  fdb_commit(dbfile,'\0');
  fdb_compact(dbfile,"./dummy2");
  do {
    if (lVar8 == 10) {
      puts("wait for 3 seconds..");
      sleep(3);
      fdb_compact(dbfile,"./dummy3");
      lVar8 = 0;
      do {
        if (lVar8 == 10) {
          fdb_kvs_close(db);
          fdb_close(dbfile);
          for (lVar8 = 0; lVar8 != 10; lVar8 = lVar8 + 1) {
            fdb_doc_free(apfStack_4b8[lVar8]);
          }
          fdb_shutdown();
          memleak_end();
          __format = "%s PASSED\n";
          if (purge_logically_deleted_doc_test()::__test_pass != '\0') {
            __format = "%s FAILED\n";
          }
          fprintf(_stderr,__format,"purge logically deleted doc test");
          return;
        }
        fdb_doc_create(&rdoc,apfStack_4b8[lVar8]->key,apfStack_4b8[lVar8]->keylen,(void *)0x0,0,
                       (void *)0x0,0);
        fVar5 = fdb_get(db,rdoc);
        pfVar4 = rdoc;
        if (lVar8 == 5) {
          if (fVar5 != FDB_RESULT_KEY_NOT_FOUND) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0xd16);
            purge_logically_deleted_doc_test()::__test_pass = 1;
            __assert_fail("status == FDB_RESULT_KEY_NOT_FOUND",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                          ,0xd16,"void purge_logically_deleted_doc_test()");
          }
        }
        else {
          if (fVar5 != FDB_RESULT_SUCCESS) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0xd11);
            purge_logically_deleted_doc_test()::__test_pass = 1;
            __assert_fail("status == FDB_RESULT_SUCCESS",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                          ,0xd11,"void purge_logically_deleted_doc_test()");
          }
          pvVar1 = rdoc->meta;
          pfVar2 = apfStack_4b8[lVar8];
          pvVar3 = pfVar2->meta;
          iVar6 = bcmp(pvVar1,pvVar3,rdoc->metalen);
          if (iVar6 != 0) {
            fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar3,pvVar1,
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0xd12);
            purge_logically_deleted_doc_test()::__test_pass = 1;
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                          ,0xd12,"void purge_logically_deleted_doc_test()");
          }
          pvVar1 = pfVar4->body;
          pvVar3 = pfVar2->body;
          iVar6 = bcmp(pvVar1,pvVar3,pfVar4->bodylen);
          if (iVar6 != 0) {
            fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar3,pvVar1,
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0xd13);
            purge_logically_deleted_doc_test()::__test_pass = 1;
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                          ,0xd13,"void purge_logically_deleted_doc_test()");
          }
        }
        fdb_doc_free(pfVar4);
        rdoc = (fdb_doc *)0x0;
        fdb_doc_create(&rdoc,apfStack_4b8[lVar8]->key,apfStack_4b8[lVar8]->keylen,(void *)0x0,0,
                       (void *)0x0,0);
        fVar5 = fdb_get_metaonly(db,rdoc);
        if (lVar8 == 5) {
          if (fVar5 != FDB_RESULT_KEY_NOT_FOUND) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0xd23);
            purge_logically_deleted_doc_test()::__test_pass = 1;
            __assert_fail("status == FDB_RESULT_KEY_NOT_FOUND",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                          ,0xd23,"void purge_logically_deleted_doc_test()");
          }
        }
        else if (fVar5 != FDB_RESULT_SUCCESS) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0xd20);
          purge_logically_deleted_doc_test()::__test_pass = 1;
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                        ,0xd20,"void purge_logically_deleted_doc_test()");
        }
        fdb_doc_free(rdoc);
        rdoc = (fdb_doc *)0x0;
        lVar8 = lVar8 + 1;
      } while( true );
    }
    fdb_doc_create(&rdoc,apfStack_4b8[lVar8]->key,apfStack_4b8[lVar8]->keylen,(void *)0x0,0,
                   (void *)0x0,0);
    fVar5 = fdb_get(db,rdoc);
    pfVar4 = rdoc;
    if (lVar8 == 5) {
      if (fVar5 != FDB_RESULT_KEY_NOT_FOUND) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0xcee);
        purge_logically_deleted_doc_test()::__test_pass = 1;
        __assert_fail("status == FDB_RESULT_KEY_NOT_FOUND",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0xcee,"void purge_logically_deleted_doc_test()");
      }
    }
    else {
      if (fVar5 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0xce9);
        purge_logically_deleted_doc_test()::__test_pass = 1;
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0xce9,"void purge_logically_deleted_doc_test()");
      }
      pvVar1 = rdoc->meta;
      pfVar2 = apfStack_4b8[lVar8];
      pvVar3 = pfVar2->meta;
      iVar6 = bcmp(pvVar1,pvVar3,rdoc->metalen);
      if (iVar6 != 0) {
        fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar3,pvVar1,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0xcea);
        purge_logically_deleted_doc_test()::__test_pass = 1;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0xcea,"void purge_logically_deleted_doc_test()");
      }
      pvVar1 = pfVar4->body;
      pvVar3 = pfVar2->body;
      iVar6 = bcmp(pvVar1,pvVar3,pfVar4->bodylen);
      if (iVar6 != 0) {
        fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar3,pvVar1,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0xceb);
        purge_logically_deleted_doc_test()::__test_pass = 1;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0xceb,"void purge_logically_deleted_doc_test()");
      }
    }
    fdb_doc_free(pfVar4);
    rdoc = (fdb_doc *)0x0;
    fdb_doc_create(&rdoc,apfStack_4b8[lVar8]->key,apfStack_4b8[lVar8]->keylen,(void *)0x0,0,
                   (void *)0x0,0);
    fVar5 = fdb_get_metaonly(db,rdoc);
    if (lVar8 == 5) {
      if ((fVar5 != FDB_RESULT_KEY_NOT_FOUND) && (fVar5 != FDB_RESULT_SUCCESS)) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0xcfd);
        purge_logically_deleted_doc_test()::__test_pass = 1;
        __assert_fail("status == FDB_RESULT_SUCCESS || status == FDB_RESULT_KEY_NOT_FOUND",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0xcfd,"void purge_logically_deleted_doc_test()");
      }
    }
    else if (fVar5 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0xcf8);
      purge_logically_deleted_doc_test()::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0xcf8,"void purge_logically_deleted_doc_test()");
    }
    fdb_doc_free(rdoc);
    rdoc = (fdb_doc *)0x0;
    lVar8 = lVar8 + 1;
  } while( true );
}

Assistant:

void purge_logically_deleted_doc_test()
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 10;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_doc *rdoc = NULL;
    fdb_status status;

    char keybuf[256], metabuf[256], bodybuf[256];

    // remove previous dummy files
    r = system(SHELL_DEL" dummy* fdb_test_config.json > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 0;
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.purging_interval = 2;
    fconfig.compaction_threshold = 0;

    // open db
    fdb_open(&dbfile, "./dummy1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "purge_logically_deleted_doc_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // insert documents
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
    }

    // remove document #5
    fdb_doc_create(&rdoc, doc[5]->key, doc[5]->keylen, doc[5]->meta, doc[5]->metalen, NULL, 0);
    status = fdb_del(db, rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    fdb_doc_free(rdoc);
    rdoc = NULL;

    // commit
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // do compaction
    fdb_compact(dbfile, (char *) "./dummy2");

    // retrieve documents after compaction
    for (i=0;i<n;++i){
        // search by key
        fdb_doc_create(&rdoc, doc[i]->key, doc[i]->keylen, NULL, 0, NULL, 0);
        status = fdb_get(db, rdoc);

        if (i != 5) {
            // updated documents
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
            TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
        } else {
            // removed document
            TEST_CHK(status == FDB_RESULT_KEY_NOT_FOUND);
        }
        // free result document
        fdb_doc_free(rdoc);
        rdoc = NULL;

        // retrieve metadata
        fdb_doc_create(&rdoc, doc[i]->key, doc[i]->keylen, NULL, 0, NULL, 0);
        status = fdb_get_metaonly(db, rdoc);
        if (i != 5) {
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        } else {
            // If the above compaction takes longer than two secs (e.g., slow disk),
            // then, fdb_get_metaonly will return KEY_NOT_FOUND error.
            TEST_CHK(status == FDB_RESULT_SUCCESS ||
                     status == FDB_RESULT_KEY_NOT_FOUND);
        }
        fdb_doc_free(rdoc);
        rdoc = NULL;
    }

    printf("wait for 3 seconds..\n");
    sleep(3);

    // do one more compaction
    fdb_compact(dbfile, (char *) "./dummy3");

    // retrieve documents after compaction
    for (i=0;i<n;++i){
        // search by key
        fdb_doc_create(&rdoc, doc[i]->key, doc[i]->keylen, NULL, 0, NULL, 0);
        status = fdb_get(db, rdoc);

        if (i != 5) {
            // updated documents
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
            TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
        } else {
            // removed document
            TEST_CHK(status == FDB_RESULT_KEY_NOT_FOUND);
        }
        // free result document
        fdb_doc_free(rdoc);
        rdoc = NULL;

        // retrieve metadata
        fdb_doc_create(&rdoc, doc[i]->key, doc[i]->keylen, NULL, 0, NULL, 0);
        status = fdb_get_metaonly(db, rdoc);
        if (i != 5) {
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        } else {
            // logically deletec document must be purged during the compaction
            TEST_CHK(status == FDB_RESULT_KEY_NOT_FOUND);
        }
        fdb_doc_free(rdoc);
        rdoc = NULL;
    }

    // close db file
    fdb_kvs_close(db);
    fdb_close(dbfile);

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    // free all resources
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("purge logically deleted doc test");
}